

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O1

void write_safe_str(FIOBJ dest,FIOBJ str)

{
  char *pcVar1;
  byte bVar2;
  ulong str_00;
  char cVar3;
  char cVar4;
  fiobj_object_vtable_s *pfVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  bool bVar17;
  fio_str_info_s ret_4;
  fio_str_info_s t;
  fio_str_info_s s;
  fio_str_info_s local_a8;
  fio_str_info_s local_88;
  ulong local_70;
  fio_str_info_s local_68;
  ulong local_48;
  char *local_40;
  long local_38;
  
  if (str == 0) {
LAB_00160ab1:
    local_68.data = anon_var_dwarf_20f;
    local_68.len._0_4_ = 4;
    goto LAB_00160ac4;
  }
  if ((str & 1) == 0) {
    uVar8 = (uint)str & 6;
    cVar3 = '(';
    switch(uVar8) {
    case 0:
switchD_00160a7e_caseD_0:
      cVar3 = *(char *)(str & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00160a7e_caseD_4:
      cVar3 = '*';
      break;
    case 6:
      if ((char)str == '&') {
        local_68.data = anon_var_dwarf_21a;
        local_68.len._0_4_ = 5;
      }
      else {
        uVar9 = (uint)str & 0xff;
        if (uVar9 != 0x16) {
          if (uVar9 == 6) goto LAB_00160ab1;
          switch(uVar8) {
          case 0:
            goto switchD_00160a7e_caseD_0;
          case 4:
            goto switchD_00160a7e_caseD_4;
          case 6:
            cVar3 = (char)str;
          }
          break;
        }
        local_68.data = anon_var_dwarf_225;
        local_68.len._0_4_ = 4;
      }
LAB_00160ac4:
      local_68.capa._0_4_ = 0;
      local_68.capa._4_4_ = 0;
      local_68.len._4_4_ = 0;
      goto LAB_00160b61;
    }
    switch(cVar3) {
    case '\'':
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar5 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar5->to_str)(&local_68,str);
  }
  else {
    fio_ltocstr(&local_68,(long)str >> 1);
  }
LAB_00160b61:
  cVar3 = (char)dest;
  uVar8 = (uint)dest;
  lVar13 = (long)dest >> 1;
  if (dest == 0) {
LAB_00160bb7:
    local_88.data = anon_var_dwarf_20f;
    uVar9 = 4;
    goto LAB_00160bca;
  }
  if ((dest & 1) == 0) {
    cVar4 = '(';
    switch(uVar8 & 6) {
    case 0:
switchD_00160b80_caseD_0:
      cVar4 = *(char *)(dest & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00160b80_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if (cVar3 == '&') {
        local_88.data = anon_var_dwarf_21a;
        uVar9 = 5;
      }
      else {
        if ((uVar8 & 0xff) != 0x16) {
          if ((uVar8 & 0xff) == 6) goto LAB_00160bb7;
          switch(uVar8 & 6) {
          case 0:
            goto switchD_00160b80_caseD_0;
          case 4:
            goto switchD_00160b80_caseD_4;
          case 6:
            cVar4 = cVar3;
          }
          break;
        }
        local_88.data = anon_var_dwarf_225;
        uVar9 = 4;
      }
LAB_00160bca:
      local_88.capa = 0;
      local_88.len = (size_t)uVar9;
      goto LAB_00160c6a;
    }
    switch(cVar4) {
    case '\'':
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar5 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar5->to_str)(&local_88,dest);
  }
  else {
    fio_ltocstr(&local_88,lVar13);
  }
LAB_00160c6a:
  local_88.data[local_88.len] = '\"';
  local_88.len = local_88.len + 1;
  fiobj_str_resize(dest,local_88.len);
  if (dest == 0) {
LAB_00160cde:
    local_a8.data = anon_var_dwarf_20f;
    local_a8.len._0_4_ = 4;
    goto LAB_00160cf1;
  }
  if ((dest & 1) == 0) {
    cVar4 = '(';
    switch(uVar8 & 6) {
    case 0:
switchD_00160cac_caseD_0:
      cVar4 = *(char *)(dest & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00160cac_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if (cVar3 == '&') {
        local_a8.data = anon_var_dwarf_21a;
        local_a8.len._0_4_ = 5;
      }
      else {
        if ((uVar8 & 0xff) != 0x16) {
          if ((uVar8 & 0xff) == 6) goto LAB_00160cde;
          switch(uVar8 & 6) {
          case 0:
            goto switchD_00160cac_caseD_0;
          case 4:
            goto switchD_00160cac_caseD_4;
          case 6:
            cVar4 = cVar3;
          }
          break;
        }
        local_a8.data = anon_var_dwarf_225;
        local_a8.len._0_4_ = 4;
      }
LAB_00160cf1:
      local_a8.capa._0_4_ = 0;
      local_a8.capa._4_4_ = 0;
      local_a8.len._4_4_ = 0;
      goto LAB_00160d8e;
    }
    switch(cVar4) {
    case '\'':
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar5 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar5->to_str)(&local_a8,dest);
  }
  else {
    fio_ltocstr(&local_a8,lVar13);
  }
LAB_00160d8e:
  pcVar12 = local_68.data;
  local_88.data = local_a8.data;
  local_88.capa = CONCAT44(local_a8.capa._4_4_,(undefined4)local_a8.capa);
  sVar16 = CONCAT44(local_a8.len._4_4_,(undefined4)local_a8.len);
  uVar15 = CONCAT44(local_68.len._4_4_,(undefined4)local_68.len);
  local_88.len = sVar16;
  uVar6 = fiobj_str_capa(dest);
  sVar14 = sVar16 + CONCAT44(local_68.len._4_4_,(undefined4)local_68.len) + 0x40;
  local_70 = dest;
  if (sVar14 < uVar6) goto LAB_00160f06;
  uVar6 = fiobj_str_capa_assert(dest,sVar14);
  if (dest == 0) {
LAB_00160e3c:
    local_a8.data = anon_var_dwarf_20f;
    local_a8.len._0_4_ = 4;
    goto LAB_00160e4f;
  }
  if ((dest & 1) == 0) {
    cVar3 = '(';
    switch(uVar8 & 6) {
    case 0:
switchD_00160e00_caseD_0:
      cVar3 = *(char *)(local_70 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00160e00_caseD_4:
      cVar3 = '*';
      break;
    case 6:
      if ((char)local_70 == '&') {
        local_a8.data = anon_var_dwarf_21a;
        local_a8.len._0_4_ = 5;
      }
      else {
        uVar9 = (uint)local_70 & 0xff;
        if (uVar9 != 0x16) {
          if (uVar9 == 6) goto LAB_00160e3c;
          switch(uVar8 & 6) {
          case 0:
            goto switchD_00160e00_caseD_0;
          case 4:
            goto switchD_00160e00_caseD_4;
          case 6:
            cVar3 = (char)local_70;
          }
          break;
        }
        local_a8.data = anon_var_dwarf_225;
        local_a8.len._0_4_ = 4;
      }
LAB_00160e4f:
      local_a8.capa._0_4_ = 0;
      local_a8.capa._4_4_ = 0;
      local_a8.len._4_4_ = 0;
      goto LAB_00160eee;
    }
    switch(cVar3) {
    case '\'':
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar5 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar5->to_str)(&local_a8,local_70);
  }
  else {
    fio_ltocstr(&local_a8,lVar13);
  }
LAB_00160eee:
  local_88.data = local_a8.data;
  local_88.capa = CONCAT44(local_a8.capa._4_4_,(undefined4)local_a8.capa);
  local_88.len = CONCAT44(local_a8.len._4_4_,(undefined4)local_a8.len);
LAB_00160f06:
  local_38 = (long)local_70 >> 1;
  local_48 = (ulong)((uint)local_70 & 6);
  local_40 = (char *)(local_70 & 0xfffffffffffffff8);
  uVar7 = 0;
  do {
    str_00 = local_70;
    sVar14 = sVar16;
    if (uVar15 == 0) break;
    uVar10 = 0;
    bVar17 = false;
    do {
      bVar2 = pcVar12[uVar10];
      if (bVar2 < 0x21) {
        if (bVar2 < 0x20) {
          switch(bVar2) {
          case 8:
            (local_88.data + sVar16 + uVar10)[0] = '\\';
            (local_88.data + sVar16 + uVar10)[1] = 'b';
            break;
          case 9:
            (local_88.data + sVar16 + uVar10)[0] = '\\';
            (local_88.data + sVar16 + uVar10)[1] = 't';
            break;
          case 10:
            (local_88.data + sVar16 + uVar10)[0] = '\\';
            (local_88.data + sVar16 + uVar10)[1] = 'n';
            break;
          default:
switchD_00160f98_caseD_b:
            lVar13 = sVar16 + uVar10;
            pcVar1 = local_88.data + lVar13;
            pcVar1[0] = '\\';
            pcVar1[1] = 'u';
            pcVar1[2] = '0';
            pcVar1[3] = '0';
            local_88.data[lVar13 + 4] = "0123456789ABCDEF"[(byte)pcVar12[uVar10] >> 4];
            sVar14 = sVar16 + uVar10 + 6;
            local_88.data[lVar13 + 5] = "0123456789ABCDEF"[(byte)pcVar12[uVar10] & 0xf];
            uVar7 = uVar7 + 4;
            goto LAB_00161010;
          case 0xc:
            (local_88.data + sVar16 + uVar10)[0] = '\\';
            (local_88.data + sVar16 + uVar10)[1] = 'f';
            break;
          case 0xd:
            (local_88.data + sVar16 + uVar10)[0] = '\\';
            (local_88.data + sVar16 + uVar10)[1] = 'r';
          }
LAB_0016100d:
          sVar14 = sVar16 + uVar10 + 2;
          uVar7 = uVar7 + 1;
        }
        else {
          if (bVar2 != 0x20) {
            if ((bVar2 == 0x22) || (bVar2 == 0x2f)) goto LAB_00160fbd;
            goto switchD_00160f98_caseD_b;
          }
          sVar14 = sVar16 + uVar10 + 1;
          local_88.data[sVar16 + uVar10] = ' ';
        }
LAB_00161010:
        pcVar12 = pcVar12 + uVar10 + 1;
        uVar11 = ~uVar10 + uVar15;
        if ((0x2f < uVar7) && (uVar15 = ((uVar15 + sVar14) - uVar10) + 0x3f, uVar6 <= uVar15)) {
          local_88.data[sVar14] = '\0';
          fiobj_str_resize(local_70,sVar14);
          fiobj_str_capa_assert(str_00,uVar15);
          if (str_00 == 0) {
LAB_0016110e:
            local_a8.data = anon_var_dwarf_20f;
            local_a8.len._0_4_ = 4;
            goto LAB_00161121;
          }
          if ((str_00 & 1) == 0) {
            cVar3 = '(';
            switch((long)&switchD_00161080::switchdataD_001714ac +
                   (long)(int)(&switchD_00161080::switchdataD_001714ac)[local_48]) {
            case 0x161082:
switchD_00161080_caseD_161082:
              cVar3 = *local_40;
              break;
            case 0x1610fa:
              if ((char)str_00 == '&') {
                local_a8.data = anon_var_dwarf_21a;
                local_a8.len._0_4_ = 5;
              }
              else {
                uVar8 = (uint)str_00 & 0xff;
                if (uVar8 != 0x16) {
                  if (uVar8 == 6) goto LAB_0016110e;
                  switch((long)&switchD_00161167::switchdataD_001714c8 +
                         (long)(int)(&switchD_00161167::switchdataD_001714c8)[local_48]) {
                  case 0x161082:
                    goto switchD_00161080_caseD_161082;
                  case 0x161169:
                    goto switchD_00161080_caseD_161169;
                  case 0x1611ea:
                    cVar3 = (char)str_00;
                  }
                  break;
                }
                local_a8.data = anon_var_dwarf_225;
                local_a8.len._0_4_ = 4;
              }
LAB_00161121:
              local_a8.capa._0_4_ = 0;
              local_a8.capa._4_4_ = 0;
              local_a8.len._4_4_ = 0;
              goto LAB_001611c1;
            case 0x161169:
switchD_00161080_caseD_161169:
              cVar3 = '*';
            }
            pfVar5 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar3) {
            case '\'':
              pfVar5 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              pfVar5 = &FIOBJECT_VTABLE_STRING;
              break;
            case ')':
              pfVar5 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              pfVar5 = &FIOBJECT_VTABLE_HASH;
              break;
            case '+':
              pfVar5 = &FIOBJECT_VTABLE_DATA;
            }
            (*pfVar5->to_str)(&local_a8,str_00);
          }
          else {
            fio_ltocstr(&local_a8,local_38);
          }
LAB_001611c1:
          local_88.data = local_a8.data;
          uVar6 = CONCAT44(local_a8.capa._4_4_,(undefined4)local_a8.capa);
          local_88.len = CONCAT44(local_a8.len._4_4_,(undefined4)local_a8.len);
          uVar7 = 0;
          local_88.capa = uVar6;
        }
        goto LAB_001611db;
      }
      if ((bVar2 == 0x22) || (bVar2 == 0x5c)) {
LAB_00160fbd:
        local_88.data[sVar16 + uVar10] = '\\';
        local_88.data[sVar16 + uVar10 + 1] = pcVar12[uVar10];
        goto LAB_0016100d;
      }
      local_88.data[uVar10 + sVar16] = bVar2;
      uVar10 = uVar10 + 1;
      bVar17 = uVar15 == uVar10;
    } while (!bVar17);
    sVar14 = sVar16 + uVar10;
    pcVar12 = pcVar12 + uVar10;
    uVar11 = 0;
LAB_001611db:
    uVar15 = uVar11;
    sVar16 = sVar14;
  } while (!bVar17);
  local_88.data[sVar14] = '\"';
  fiobj_str_resize(local_70,sVar14 + 1);
  return;
}

Assistant:

static void write_safe_str(FIOBJ dest, const FIOBJ str) {
  fio_str_info_s s = fiobj_obj2cstr(str);
  fio_str_info_s t = fiobj_obj2cstr(dest);
  t.data[t.len] = '"';
  t.len++;
  fiobj_str_resize(dest, t.len);
  t = fiobj_obj2cstr(dest);
  const uint8_t *restrict src = (const uint8_t *)s.data;
  size_t len = s.len;
  uint64_t end = t.len;
  /* make sure we have some room */
  size_t added = 0;
  size_t capa = fiobj_str_capa(dest);
  if (capa <= end + s.len + 64) {
    if (0) {
      capa = (((capa >> 12) + 1) << 12) - 1;
      capa = fiobj_str_capa_assert(dest, capa);
    } else {
      capa = fiobj_str_capa_assert(dest, (end + s.len + 64));
    }
    fio_str_info_s tmp = fiobj_obj2cstr(dest);
    t = tmp;
  }
  while (len) {
    char *restrict writer = (char *)t.data;
    while (len && src[0] > 32 && src[0] != '"' && src[0] != '\\') {
      len--;
      writer[end++] = *(src++);
    }
    if (!len)
      break;
    switch (src[0]) {
    case '\b':
      writer[end++] = '\\';
      writer[end++] = 'b';
      added++;
      break; /* from switch */
    case '\f':
      writer[end++] = '\\';
      writer[end++] = 'f';
      added++;
      break; /* from switch */
    case '\n':
      writer[end++] = '\\';
      writer[end++] = 'n';
      added++;
      break; /* from switch */
    case '\r':
      writer[end++] = '\\';
      writer[end++] = 'r';
      added++;
      break; /* from switch */
    case '\t':
      writer[end++] = '\\';
      writer[end++] = 't';
      added++;
      break; /* from switch */
    case '"':
    case '\\':
    case '/':
      writer[end++] = '\\';
      writer[end++] = src[0];
      added++;
      break; /* from switch */
    default:
      if (src[0] <= 31) {
        /* MUST escape all control values less than 32 */
        writer[end++] = '\\';
        writer[end++] = 'u';
        writer[end++] = '0';
        writer[end++] = '0';
        writer[end++] = hex_chars[src[0] >> 4];
        writer[end++] = hex_chars[src[0] & 15];
        added += 4;
      } else
        writer[end++] = src[0];
      break; /* from switch */
    }
    src++;
    len--;
    if (added >= 48 && capa <= end + len + 64) {
      writer[end] = 0;
      fiobj_str_resize(dest, end);
      fiobj_str_capa_assert(dest, (end + len + 64));
      t = fiobj_obj2cstr(dest);
      writer = (char *)t.data;
      capa = t.capa;
      added = 0;
    }
  }
  t.data[end++] = '"';
  fiobj_str_resize(dest, end);
}